

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  secp256k1_fe *r_00;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  uint64_t uVar177;
  uint64_t uVar178;
  uint64_t uVar179;
  int iVar180;
  ulong uVar181;
  long lVar182;
  ulong extraout_RDX;
  ulong uVar183;
  ulong uVar184;
  secp256k1_gej *psVar185;
  ulong uVar186;
  secp256k1_gej *a_00;
  secp256k1_gej *a_01;
  ulong uVar187;
  ulong uVar188;
  ulong uVar189;
  secp256k1_gej *psVar190;
  uint64_t tmp3_2;
  uint64_t tmp2_2;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  uint64_t tmp3_3;
  secp256k1_fe s2;
  secp256k1_fe z12;
  secp256k1_fe z22;
  undefined1 local_258 [56];
  uint64_t uStack_220;
  uint64_t local_218;
  uint64_t uStack_210;
  uint64_t local_208;
  int local_200;
  undefined1 local_1f8 [104];
  uint64_t uStack_190;
  uint64_t local_188;
  uint64_t uStack_180;
  uint64_t local_178;
  int local_170;
  undefined1 local_168 [56];
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  uint64_t local_118;
  int local_110;
  ulong local_100;
  undefined1 local_f8 [56];
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  uint64_t local_a8;
  undefined8 local_a0;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  psVar185 = a;
  secp256k1_gej_verify(a);
  a_01 = b;
  secp256k1_gej_verify(b);
  if (a->infinity == 0) {
    if (b->infinity != 0) {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
        rzr->magnitude = 1;
        rzr->normalized = 1;
        secp256k1_fe_verify(rzr);
      }
      goto LAB_00154069;
    }
    psVar1 = &b->z;
    a_01 = (secp256k1_gej *)psVar1;
    secp256k1_fe_verify(psVar1);
    if (8 < (b->z).magnitude) goto LAB_00155167;
    uVar184 = psVar1->n[0];
    uVar188 = (b->z).n[1];
    uVar186 = (b->z).n[2];
    uVar187 = (b->z).n[3];
    uVar189 = (b->z).n[4];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar184 * 2;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar187;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar188 * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar186;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar189;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar189;
    uVar181 = SUB168(auVar7 * auVar87,0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar181 & 0xfffffffffffff;
    auVar5 = auVar6 * auVar86 + auVar5 * auVar85 + auVar8 * ZEXT816(0x1000003d10);
    uVar183 = auVar5._0_8_;
    local_90.n[0] = uVar183 & 0xfffffffffffff;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar183 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar189 = uVar189 * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar184;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar189;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar188 * 2;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar187;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar186;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar186;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar181 >> 0x34 | SUB168(auVar7 * auVar87,8) << 0xc;
    auVar5 = auVar9 * auVar88 + auVar149 + auVar10 * auVar89 + auVar11 * auVar90 +
             auVar12 * ZEXT816(0x1000003d10);
    uVar181 = auVar5._0_8_;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar181 >> 0x34 | auVar5._8_8_ << 0xc;
    local_168._0_8_ = (uVar181 & 0xfffffffffffff) >> 0x30;
    psVar185 = (secp256k1_gej *)(uVar181 & 0xffffffffffff);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar184;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar184;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar188;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar189;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar186 * 2;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar187;
    auVar5 = auVar14 * auVar92 + auVar150 + auVar15 * auVar93;
    uVar181 = auVar5._0_8_;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar181 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | local_168._0_8_;
    auVar5 = auVar13 * auVar91 + ZEXT816(0x1000003d1) * auVar94;
    uVar181 = auVar5._0_8_;
    local_60.n[0] = uVar181 & 0xfffffffffffff;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar181 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar184 * 2;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar188;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar186;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar189;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar187;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar187;
    auVar6 = auVar17 * auVar96 + auVar152 + auVar18 * auVar97;
    uVar181 = auVar6._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar181 & 0xfffffffffffff;
    auVar5 = auVar16 * auVar95 + auVar151 + auVar19 * ZEXT816(0x1000003d10);
    uVar183 = auVar5._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar181 >> 0x34 | auVar6._8_8_ << 0xc;
    local_60.n[1] = uVar183 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar183 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar184 * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar186;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar188;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar188;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar187;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar189;
    auVar154 = auVar22 * auVar100 + auVar154;
    uVar184 = auVar154._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar184 & 0xfffffffffffff;
    auVar5 = auVar20 * auVar98 + auVar153 + auVar21 * auVar99 + auVar23 * ZEXT816(0x1000003d10);
    uVar188 = auVar5._0_8_;
    local_60.n[2] = uVar188 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = (uVar188 >> 0x34 | auVar5._8_8_ << 0xc) + local_90.n[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar184 >> 0x34 | auVar154._8_8_ << 0xc;
    auVar155 = auVar24 * ZEXT816(0x1000003d10) + auVar155;
    uVar184 = auVar155._0_8_;
    local_60.n[3] = uVar184 & 0xfffffffffffff;
    local_60.n[4] = (long)(psVar185->x).n + (uVar184 >> 0x34 | auVar155._8_8_ << 0xc);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    local_168._48_8_ = psVar185;
    secp256k1_fe_verify(&local_60);
    a_00 = (secp256k1_gej *)&a->z;
    a_01 = a_00;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    if (8 < (a->z).magnitude) goto LAB_0015516c;
    uVar184 = ((secp256k1_fe *)a_00)->n[0];
    uVar188 = (a->z).n[1];
    uVar186 = (a->z).n[2];
    uVar187 = (a->z).n[3];
    uVar189 = (a->z).n[4];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar184 * 2;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar187;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar188 * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar186;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar189;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar189;
    uVar181 = SUB168(auVar27 * auVar103,0);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar181 & 0xfffffffffffff;
    auVar5 = auVar26 * auVar102 + auVar25 * auVar101 + auVar28 * ZEXT816(0x1000003d10);
    uVar183 = auVar5._0_8_;
    local_168._48_8_ = uVar183 & 0xfffffffffffff;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar183 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar189 = uVar189 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar184;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar189;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar188 * 2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar187;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar186;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar186;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar181 >> 0x34 | SUB168(auVar27 * auVar103,8) << 0xc;
    auVar5 = auVar29 * auVar104 + auVar156 + auVar30 * auVar105 + auVar31 * auVar106 +
             auVar32 * ZEXT816(0x1000003d10);
    local_168._0_8_ = auVar5._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = (ulong)local_168._0_8_ >> 0x34 | auVar5._8_8_ << 0xc;
    local_1f8._96_8_ = (local_168._0_8_ & 0xfffffffffffff) >> 0x30;
    local_168._0_8_ = local_168._0_8_ & 0xffffffffffff;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar184;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar184;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar188;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar189;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar186 * 2;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar187;
    auVar5 = auVar34 * auVar108 + auVar157 + auVar35 * auVar109;
    uVar181 = auVar5._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar181 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | local_1f8._96_8_;
    auVar5 = auVar33 * auVar107 + ZEXT816(0x1000003d1) * auVar110;
    uVar181 = auVar5._0_8_;
    local_90.n[0] = uVar181 & 0xfffffffffffff;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar181 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar184 * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar188;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar186;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar189;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar187;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar187;
    auVar6 = auVar37 * auVar112 + auVar159 + auVar38 * auVar113;
    uVar181 = auVar6._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar181 & 0xfffffffffffff;
    auVar5 = auVar36 * auVar111 + auVar158 + auVar39 * ZEXT816(0x1000003d10);
    uVar183 = auVar5._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar181 >> 0x34 | auVar6._8_8_ << 0xc;
    local_90.n[1] = uVar183 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar183 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar184 * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar186;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar188;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar188;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar187;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar189;
    auVar161 = auVar42 * auVar116 + auVar161;
    uVar184 = auVar161._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar184 & 0xfffffffffffff;
    auVar5 = auVar40 * auVar114 + auVar160 + auVar41 * auVar115 + auVar43 * ZEXT816(0x1000003d10);
    uVar188 = auVar5._0_8_;
    local_90.n[2] = uVar188 & 0xfffffffffffff;
    auVar162._8_8_ = 0;
    auVar162._0_8_ =
         (long)(((secp256k1_gej *)local_168._48_8_)->x).n + (uVar188 >> 0x34 | auVar5._8_8_ << 0xc);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar184 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar162 = auVar44 * ZEXT816(0x1000003d10) + auVar162;
    uVar184 = auVar162._0_8_;
    local_90.n[3] = uVar184 & 0xfffffffffffff;
    local_90.n[4] = (uVar184 >> 0x34 | auVar162._8_8_ << 0xc) + local_168._0_8_;
    local_90.magnitude = 1;
    local_90.normalized = 0;
    secp256k1_fe_verify(&local_90);
    a_01 = (secp256k1_gej *)(local_168 + 0x30);
    secp256k1_fe_mul((secp256k1_fe *)a_01,&a->x,&local_60);
    secp256k1_fe_mul((secp256k1_fe *)local_168,&b->x,&local_90);
    r_00 = (secp256k1_fe *)(local_1f8 + 0x60);
    secp256k1_fe_mul(r_00,&a->y,&local_60);
    secp256k1_fe_mul(r_00,r_00,psVar1);
    psVar185 = (secp256k1_gej *)local_f8;
    secp256k1_fe_mul((secp256k1_fe *)psVar185,&b->y,&local_90);
    secp256k1_fe_mul((secp256k1_fe *)psVar185,(secp256k1_fe *)psVar185,(secp256k1_fe *)a_00);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < local_110) goto LAB_00155171;
    local_1f8._0_8_ = 0x3ffffbfffff0bc - local_168._48_8_;
    local_1f8._8_8_ = 0x3ffffffffffffc - uStack_130;
    local_1f8._16_8_ = 0x3ffffffffffffc - local_128;
    local_1f8._24_8_ = 0x3ffffffffffffc - uStack_120;
    local_1f8._32_8_ = 0x3fffffffffffc - local_118;
    local_1f8._40_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)local_1f8);
    secp256k1_fe_verify((secp256k1_fe *)local_1f8);
    a_01 = (secp256k1_gej *)local_168;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x20 < (int)(local_168._40_4_ + local_1f8._40_4_)) goto LAB_00155176;
    local_1f8._0_8_ = local_1f8._0_8_ + local_168._0_8_;
    local_1f8._8_8_ = local_1f8._8_8_ + local_168._8_8_;
    local_1f8._16_8_ = local_1f8._16_8_ + local_168._16_8_;
    local_1f8._24_8_ = local_1f8._24_8_ + local_168._24_8_;
    local_1f8._32_8_ = local_1f8._32_8_ + local_168._32_8_;
    local_1f8._44_4_ = 0;
    local_1f8._40_4_ = local_168._40_4_ + local_1f8._40_4_;
    secp256k1_fe_verify((secp256k1_fe *)local_1f8);
    a_01 = (secp256k1_gej *)local_f8;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < (int)local_f8._40_4_) goto LAB_0015517b;
    local_1f8._48_8_ = 0x3ffffbfffff0bc - local_f8._0_8_;
    local_1f8._56_8_ = 0x3ffffffffffffc - local_f8._8_8_;
    local_1f8._64_8_ = 0x3ffffffffffffc - local_f8._16_8_;
    local_1f8._72_8_ = 0x3ffffffffffffc - local_f8._24_8_;
    local_1f8._80_8_ = 0x3fffffffffffc - local_f8._32_8_;
    local_1f8._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)(local_1f8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(local_1f8 + 0x30));
    a_01 = (secp256k1_gej *)(local_1f8 + 0x60);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x20 < local_170 + local_1f8._88_4_) goto LAB_00155180;
    local_1f8._48_8_ = local_1f8._48_8_ + local_1f8._96_8_;
    local_1f8._56_8_ = local_1f8._56_8_ + uStack_190;
    local_1f8._64_8_ = local_1f8._64_8_ + local_188;
    local_1f8._72_8_ = local_1f8._72_8_ + uStack_180;
    local_1f8._80_8_ = local_1f8._80_8_ + local_178;
    local_1f8._92_4_ = 0;
    local_1f8._88_4_ = local_170 + local_1f8._88_4_;
    secp256k1_fe_verify((secp256k1_fe *)(local_1f8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)local_1f8);
    uVar184 = ((ulong)local_1f8._32_8_ >> 0x30) * 0x1000003d1 + local_1f8._0_8_;
    if (((uVar184 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar184 & 0xfffffffffffff) == 0)) {
      uVar188 = (uVar184 >> 0x34) + local_1f8._8_8_;
      uVar186 = (uVar188 >> 0x34) + local_1f8._16_8_;
      uVar187 = (uVar186 >> 0x34) + local_1f8._24_8_;
      uVar189 = (uVar187 >> 0x34) + (local_1f8._32_8_ & 0xffffffffffff);
      if ((((uVar188 | uVar184 | uVar186 | uVar187) & 0xfffffffffffff) == 0 && uVar189 == 0) ||
         (((uVar184 | 0x1000003d0) & uVar188 & uVar186 & uVar187 & (uVar189 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)(local_1f8 + 0x30));
        uVar184 = ((ulong)local_1f8._80_8_ >> 0x30) * 0x1000003d1 + local_1f8._48_8_;
        if (((uVar184 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar184 & 0xfffffffffffff) == 0))
        {
          uVar188 = (uVar184 >> 0x34) + local_1f8._56_8_;
          uVar186 = (uVar188 >> 0x34) + local_1f8._64_8_;
          uVar187 = (uVar186 >> 0x34) + local_1f8._72_8_;
          uVar189 = (uVar187 >> 0x34) + (local_1f8._80_8_ & 0xffffffffffff);
          if ((((uVar188 | uVar184 | uVar186 | uVar187) & 0xfffffffffffff) == 0 && uVar189 == 0) ||
             (((uVar184 | 0x1000003d0) & uVar188 & uVar186 & uVar187 & (uVar189 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            secp256k1_gej_double_var(r,a,rzr);
            return;
          }
        }
        if (rzr != (secp256k1_fe *)0x0) {
          *(undefined1 (*) [16])((long)rzr->n + 0x1c) = (undefined1  [16])0x0;
          rzr->n[2] = 0;
          rzr->n[3] = 0;
          rzr->n[0] = 0;
          rzr->n[1] = 0;
          rzr->normalized = 1;
          secp256k1_fe_verify(rzr);
        }
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    secp256k1_fe_mul((secp256k1_fe *)local_258,(secp256k1_fe *)local_1f8,psVar1);
    if (rzr != (secp256k1_fe *)0x0) {
      rzr->n[4] = local_258._32_8_;
      rzr->magnitude = local_258._40_4_;
      rzr->normalized = local_258._44_4_;
      rzr->n[2] = local_258._16_8_;
      rzr->n[3] = local_258._24_8_;
      rzr->n[0] = local_258._0_8_;
      rzr->n[1] = local_258._8_8_;
    }
    secp256k1_fe_mul(&r->z,(secp256k1_fe *)a_00,(secp256k1_fe *)local_258);
    a_01 = (secp256k1_gej *)local_1f8;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (8 < (int)local_1f8._40_4_) goto LAB_00155185;
    a_01 = (secp256k1_gej *)(local_f8 + 0x30);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_1f8._0_8_ * 2;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = local_1f8._24_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_1f8._8_8_ * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_1f8._16_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_1f8._32_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_1f8._32_8_;
    uVar188 = SUB168(auVar47 * auVar119,0);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar188 & 0xfffffffffffff;
    auVar5 = auVar46 * auVar118 + auVar45 * auVar117 + auVar48 * ZEXT816(0x1000003d10);
    uVar184 = auVar5._0_8_;
    local_258._48_8_ = uVar184 & 0xfffffffffffff;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar184 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar184 = local_1f8._32_8_ * 2;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_1f8._0_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar184;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_1f8._8_8_ * 2;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = local_1f8._24_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_1f8._16_8_;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_1f8._16_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar188 >> 0x34 | SUB168(auVar47 * auVar119,8) << 0xc;
    auVar5 = auVar49 * auVar120 + auVar163 + auVar50 * auVar121 + auVar51 * auVar122 +
             auVar52 * ZEXT816(0x1000003d10);
    uVar188 = auVar5._0_8_;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar188 >> 0x34 | auVar5._8_8_ << 0xc;
    a_00 = (secp256k1_gej *)(uVar188 & 0xffffffffffff);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_1f8._0_8_;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = local_1f8._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_1f8._8_8_;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar184;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_1f8._16_8_ * 2;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_1f8._24_8_;
    auVar5 = auVar54 * auVar124 + auVar164 + auVar55 * auVar125;
    uVar186 = auVar5._0_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar186 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = (uVar186 & 0xfffffffffffff) << 4 | (uVar188 & 0xfffffffffffff) >> 0x30;
    auVar5 = auVar53 * auVar123 + ZEXT816(0x1000003d1) * auVar126;
    uVar188 = auVar5._0_8_;
    local_f8._48_8_ = uVar188 & 0xfffffffffffff;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar188 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_1f8._0_8_ * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_1f8._8_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_1f8._16_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar184;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_1f8._24_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = local_1f8._24_8_;
    auVar6 = auVar57 * auVar128 + auVar166 + auVar58 * auVar129;
    uVar188 = auVar6._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar188 & 0xfffffffffffff;
    auVar5 = auVar56 * auVar127 + auVar165 + auVar59 * ZEXT816(0x1000003d10);
    uVar186 = auVar5._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar188 >> 0x34 | auVar6._8_8_ << 0xc;
    uStack_c0 = uVar186 & 0xfffffffffffff;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar186 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_1f8._0_8_ * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = local_1f8._16_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_1f8._8_8_;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = local_1f8._8_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_1f8._24_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar184;
    auVar168 = auVar62 * auVar132 + auVar168;
    uVar184 = auVar168._0_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar184 & 0xfffffffffffff;
    auVar5 = auVar60 * auVar130 + auVar167 + auVar61 * auVar131 + auVar63 * ZEXT816(0x1000003d10);
    uVar188 = auVar5._0_8_;
    local_b8 = uVar188 & 0xfffffffffffff;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = (uVar188 >> 0x34 | auVar5._8_8_ << 0xc) + local_258._48_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar184 >> 0x34 | auVar168._8_8_ << 0xc;
    auVar169 = auVar64 * ZEXT816(0x1000003d10) + auVar169;
    uVar184 = auVar169._0_8_;
    uStack_b0 = uVar184 & 0xfffffffffffff;
    local_a8 = (long)(a_00->x).n + (uVar184 >> 0x34 | auVar169._8_8_ << 0xc);
    local_a0._0_4_ = 1;
    local_a0._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < (int)local_a0) goto LAB_0015518a;
    psVar1 = (secp256k1_fe *)(local_f8 + 0x30);
    local_f8._48_8_ = 0x3ffffbfffff0bc - local_f8._48_8_;
    uStack_c0 = 0x3ffffffffffffc - uStack_c0;
    local_b8 = 0x3ffffffffffffc - local_b8;
    uStack_b0 = 0x3ffffffffffffc - uStack_b0;
    local_a8 = 0x3fffffffffffc - local_a8;
    local_a0._0_4_ = 2;
    local_a0._4_4_ = 0;
    secp256k1_fe_verify(psVar1);
    secp256k1_fe_mul((secp256k1_fe *)(local_258 + 0x30),psVar1,(secp256k1_fe *)local_1f8);
    a_00 = (secp256k1_gej *)(local_168 + 0x30);
    secp256k1_fe_mul((secp256k1_fe *)local_258,(secp256k1_fe *)a_00,psVar1);
    secp256k1_fe_verify((secp256k1_fe *)(local_1f8 + 0x30));
    a_01 = r;
    if (8 < (int)local_1f8._88_4_) goto LAB_0015518f;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_1f8._48_8_ * 2;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = local_1f8._72_8_;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_1f8._56_8_ * 2;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_1f8._64_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_1f8._80_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = local_1f8._80_8_;
    uVar188 = SUB168(auVar67 * auVar135,0);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar188 & 0xfffffffffffff;
    auVar5 = auVar66 * auVar134 + auVar65 * auVar133 + auVar68 * ZEXT816(0x1000003d10);
    uVar186 = auVar5._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar186 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar184 = local_1f8._80_8_ * 2;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_1f8._48_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar184;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_1f8._56_8_ * 2;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_1f8._72_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_1f8._64_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_1f8._64_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar188 >> 0x34 | SUB168(auVar67 * auVar135,8) << 0xc;
    auVar5 = auVar69 * auVar136 + auVar170 + auVar70 * auVar137 + auVar71 * auVar138 +
             auVar72 * ZEXT816(0x1000003d10);
    uVar188 = auVar5._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar188 >> 0x34 | auVar5._8_8_ << 0xc;
    local_100 = (uVar188 & 0xfffffffffffff) >> 0x30;
    a_00 = (secp256k1_gej *)(uVar188 & 0xffffffffffff);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_1f8._48_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = local_1f8._48_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_1f8._56_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar184;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_1f8._64_8_ * 2;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = local_1f8._72_8_;
    auVar5 = auVar74 * auVar140 + auVar171 + auVar75 * auVar141;
    uVar188 = auVar5._0_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar188 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = (uVar188 & 0xfffffffffffff) << 4 | local_100;
    auVar5 = auVar73 * auVar139 + ZEXT816(0x1000003d1) * auVar142;
    uVar188 = auVar5._0_8_;
    (r->x).n[0] = uVar188 & 0xfffffffffffff;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar188 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_1f8._48_8_ * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = local_1f8._56_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_1f8._64_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar184;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_1f8._72_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = local_1f8._72_8_;
    auVar6 = auVar77 * auVar144 + auVar173 + auVar78 * auVar145;
    uVar188 = auVar6._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar188 & 0xfffffffffffff;
    auVar5 = auVar76 * auVar143 + auVar172 + auVar79 * ZEXT816(0x1000003d10);
    uVar187 = auVar5._0_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar188 >> 0x34 | auVar6._8_8_ << 0xc;
    (r->x).n[1] = uVar187 & 0xfffffffffffff;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar187 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_1f8._48_8_ * 2;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = local_1f8._64_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = local_1f8._56_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = local_1f8._56_8_;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_1f8._72_8_;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar184;
    auVar175 = auVar82 * auVar148 + auVar175;
    uVar184 = auVar175._0_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar184 & 0xfffffffffffff;
    auVar5 = auVar80 * auVar146 + auVar174 + auVar81 * auVar147 + auVar83 * ZEXT816(0x1000003d10);
    uVar188 = auVar5._0_8_;
    (r->x).n[2] = uVar188 & 0xfffffffffffff;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = (uVar188 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar186 & 0xfffffffffffff);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar184 >> 0x34 | auVar175._8_8_ << 0xc;
    auVar176 = auVar84 * ZEXT816(0x1000003d10) + auVar176;
    uVar184 = auVar176._0_8_;
    (r->x).n[3] = uVar184 & 0xfffffffffffff;
    (r->x).n[4] = (long)(a_00->x).n + (uVar184 >> 0x34 | auVar176._8_8_ << 0xc);
    (r->x).magnitude = 1;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    a_01 = (secp256k1_gej *)(local_258 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar180 = local_200 + (r->x).magnitude;
    if (0x20 < iVar180) goto LAB_00155194;
    uVar177 = (r->x).n[1];
    uVar178 = (r->x).n[2];
    uVar179 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_258._48_8_;
    (r->x).n[1] = uVar177 + uStack_220;
    (r->x).n[2] = uVar178 + local_218;
    (r->x).n[3] = uVar179 + uStack_210;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_208;
    (r->x).magnitude = iVar180;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    a_01 = (secp256k1_gej *)local_258;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar180 = local_258._40_4_ + (r->x).magnitude;
    if (0x20 < iVar180) goto LAB_00155199;
    uVar177 = (r->x).n[1];
    uVar178 = (r->x).n[2];
    uVar179 = (r->x).n[3];
    a_01 = (secp256k1_gej *)local_258;
    (r->x).n[0] = (r->x).n[0] + local_258._0_8_;
    (r->x).n[1] = uVar177 + local_258._8_8_;
    (r->x).n[2] = uVar178 + local_258._16_8_;
    (r->x).n[3] = uVar179 + local_258._24_8_;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_258._32_8_;
    (r->x).magnitude = iVar180;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar180 = local_258._40_4_ + (r->x).magnitude;
    if (0x20 < iVar180) goto LAB_0015519e;
    uVar177 = (r->x).n[1];
    uVar178 = (r->x).n[2];
    uVar179 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_258._0_8_;
    (r->x).n[1] = uVar177 + local_258._8_8_;
    (r->x).n[2] = uVar178 + local_258._16_8_;
    (r->x).n[3] = uVar179 + local_258._24_8_;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_258._32_8_;
    (r->x).magnitude = iVar180;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)local_258);
    a_01 = r;
    secp256k1_fe_verify(&r->x);
    iVar180 = (r->x).magnitude + local_258._40_4_;
    if (iVar180 < 0x21) {
      local_258._0_8_ = (r->x).n[0] + local_258._0_8_;
      local_258._8_8_ = (r->x).n[1] + local_258._8_8_;
      local_258._16_8_ = (r->x).n[2] + local_258._16_8_;
      local_258._24_8_ = (r->x).n[3] + local_258._24_8_;
      local_258._32_8_ = local_258._32_8_ + (r->x).n[4];
      local_258._44_4_ = 0;
      local_258._40_4_ = iVar180;
      secp256k1_fe_verify((secp256k1_fe *)local_258);
      psVar1 = &r->y;
      secp256k1_fe_mul(psVar1,(secp256k1_fe *)local_258,(secp256k1_fe *)(local_1f8 + 0x30));
      a_01 = (secp256k1_gej *)(local_258 + 0x30);
      a_00 = a_01;
      secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,(secp256k1_fe *)(local_1f8 + 0x60))
      ;
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      local_200 = local_200 + (r->y).magnitude;
      if (local_200 < 0x21) {
        uVar177 = (r->y).n[1];
        uVar178 = (r->y).n[2];
        uVar179 = (r->y).n[3];
        (r->y).n[0] = (r->y).n[0] + local_258._48_8_;
        (r->y).n[1] = uVar177 + uStack_220;
        (r->y).n[2] = uVar178 + local_218;
        (r->y).n[3] = uVar179 + uStack_210;
        puVar2 = (r->y).n + 4;
        *puVar2 = *puVar2 + local_208;
        (r->y).magnitude = local_200;
        (r->y).normalized = 0;
        secp256k1_fe_verify(psVar1);
        secp256k1_gej_verify(r);
        return;
      }
      goto LAB_001551a8;
    }
  }
  else {
    a = b;
    if (rzr == (secp256k1_fe *)0x0) {
LAB_00154069:
      memcpy(r,a,0x98);
      return;
    }
    secp256k1_gej_add_var_cold_1();
LAB_00155167:
    secp256k1_gej_add_var_cold_15();
LAB_0015516c:
    secp256k1_gej_add_var_cold_14();
LAB_00155171:
    secp256k1_gej_add_var_cold_13();
LAB_00155176:
    secp256k1_gej_add_var_cold_12();
LAB_0015517b:
    secp256k1_gej_add_var_cold_11();
LAB_00155180:
    a_00 = psVar185;
    secp256k1_gej_add_var_cold_10();
LAB_00155185:
    secp256k1_gej_add_var_cold_9();
LAB_0015518a:
    secp256k1_gej_add_var_cold_8();
LAB_0015518f:
    secp256k1_gej_add_var_cold_7();
LAB_00155194:
    secp256k1_gej_add_var_cold_6();
LAB_00155199:
    secp256k1_gej_add_var_cold_5();
LAB_0015519e:
    secp256k1_gej_add_var_cold_4();
  }
  secp256k1_gej_add_var_cold_3();
LAB_001551a8:
  secp256k1_gej_add_var_cold_2();
  lVar182 = 0;
  psVar185 = a_01;
  do {
    psVar190 = (secp256k1_gej *)((ulong)psVar185 & 0xffffffff);
    bVar3 = *(byte *)((long)(a_00->x).n + lVar182);
    bVar4 = "scratch"[lVar182];
    psVar185 = (secp256k1_gej *)(ulong)((uint)bVar3 - (uint)bVar4);
    if (bVar3 == bVar4) {
      psVar185 = psVar190;
    }
    iVar180 = (int)psVar185;
    if (bVar3 != bVar4) goto LAB_001551e0;
    lVar182 = lVar182 + 1;
  } while (lVar182 != 8);
  iVar180 = 0;
LAB_001551e0:
  if (iVar180 == 0) {
    if (extraout_RDX < 0x1111111111111112) {
      return;
    }
  }
  else {
    (*(code *)(a_01->x).n[0])("invalid scratch space",(a_01->x).n[1]);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;

    secp256k1_gej_verify(a);
    secp256k1_gej_verify(b);
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);
    secp256k1_gej_verify(r);
}